

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O2

wchar_t cmp_for_sort_items(void *left,void *right)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  wchar_t wVar4;
  long lVar5;
  
  iVar1 = *left;
  iVar2 = *right;
  lVar5 = 8;
  do {
    pcVar3 = *(code **)(sort_dat_1 + -8 + lVar5);
    if (pcVar3 == (code *)0x0) {
      return L'\0';
    }
    wVar4 = (*pcVar3)(sort_dat_0 + (long)iVar1 * 0x38,sort_dat_0 + (long)iVar2 * 0x38,
                      *(undefined4 *)(sort_dat_1 + lVar5));
    lVar5 = lVar5 + 0x10;
  } while (wVar4 == L'\0');
  return wVar4;
}

Assistant:

static int cmp_for_sort_items(const void *left, const void *right)
{
	int ileft = *((int*) left);
	int iright = *((int*) right);
	int i = 0;

	while (1) {
		int cres;

		if (sort_dat.arr[i].func == 0) {
			return 0;
		}
		cres = (*sort_dat.arr[i].func)(sort_dat.items + ileft,
			sort_dat.items + iright, sort_dat.arr[i].propind);
		if (cres != 0) {
			return cres;
		}
		++i;
	}
}